

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

void SingleTreeSearchHelper
               (ON_RTreeBranch *a_branchA,ON_RTreeNode *a_nodeB,ON_RTreePairSearchResult *a_result)

{
  int iVar1;
  bool bVar2;
  ON_2dex *pOVar3;
  int *piVar4;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar5;
  
  iVar1 = a_nodeB->m_count;
  if (a_nodeB->m_level < 1) {
    if (0 < iVar1) {
      paVar5 = &a_nodeB->m_branch[0].field_1;
      do {
        if ((a_branchA < (ON_RTreeBranch *)(paVar5 + -6)) &&
           (bVar2 = PairSearchOverlapHelper
                              (&a_branchA->m_rect,(ON_RTreeBBox *)(paVar5 + -6),
                               a_result->m_tolerance), bVar2)) {
          pOVar3 = ON_SimpleArray<ON_2dex>::AppendNew(a_result->m_result);
          pOVar3->i = *(int *)&a_branchA->field_1;
          pOVar3->j = *(int *)paVar5;
        }
        piVar4 = (int *)(paVar5 + 1);
        paVar5 = paVar5 + 7;
      } while (piVar4 < a_nodeB->m_branch + iVar1);
    }
  }
  else if (a_nodeB < &a_nodeB->m_branch[(long)iVar1 + -1].field_1) {
    paVar5 = &a_nodeB->m_branch[0].field_1;
    do {
      bVar2 = PairSearchOverlapHelper
                        (&a_branchA->m_rect,(ON_RTreeBBox *)(paVar5 + -6),a_result->m_tolerance);
      if (bVar2) {
        SingleTreeSearchHelper(a_branchA,paVar5->m_child,a_result);
      }
      piVar4 = (int *)(paVar5 + 1);
      paVar5 = paVar5 + 7;
    } while (piVar4 < a_nodeB->m_branch + iVar1);
  }
  return;
}

Assistant:

static void SingleTreeSearchHelper(const ON_RTreeBranch* a_branchA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchResult* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchB, *branchBmax;

  branchB = a_nodeB->m_branch;
  branchBmax = branchB + a_nodeB->m_count;

  if (a_nodeB->m_level > 0)
  {
    // branchB's have children nodes and a_branchA is a leaf
    while (branchB < branchBmax)
    {
      if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
      {
        SingleTreeSearchHelper(a_branchA, branchB->m_child, a_result);
      }
      branchB++;
    }
  }
  else
  {
    // branchB's are leaves and a_branchA is a leaf
    while (branchB < branchBmax)
    {
      if (a_branchA < branchB)
      {
        if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
        {
          ON_2dex& r = a_result->m_result->AppendNew();
          r.i = (int)a_branchA->m_id;
          r.j = (int)branchB->m_id;
        }
      }
      branchB++;
    }
  }
}